

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime.c
# Opt level: O0

size_t strftime(char *__s,size_t __maxsize,char *__format,tm *__tp)

{
  char cVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  div_t dVar6;
  char local_198;
  char local_194;
  int local_180;
  div_t digit_1;
  int i_1;
  int year_3;
  div_t year_2;
  size_t count_7;
  size_t count_6;
  div_t week_2;
  div_t week_1;
  div_t week;
  size_t count_5;
  div_t sec;
  size_t count_4;
  size_t count_3;
  size_t len_4;
  char *str_4;
  int ind_4;
  div_t min;
  div_t mon;
  div_t yday;
  div_t hour_1;
  div_t hour;
  div_t digit;
  int i;
  int year_1;
  div_t year;
  size_t count_2;
  div_t day_1;
  size_t count_1;
  div_t day;
  div_t period;
  size_t count;
  size_t len_3;
  char *str_3;
  int ind_3;
  size_t len_2;
  char *str_2;
  int ind_2;
  size_t len_1;
  char *str_1;
  int ind_1;
  size_t len;
  char *str;
  ulong uStack_38;
  int ind;
  size_t rc;
  tm *timeptr_local;
  char *format_local;
  size_t maxsize_local;
  char *s_local;
  
  uStack_38 = 0;
  timeptr_local = (tm *)__format;
  do {
    while( true ) {
      if (__maxsize <= uStack_38) {
        return 0;
      }
      if ((char)timeptr_local->tm_sec == '%') break;
      cVar1 = (char)timeptr_local->tm_sec;
      __s[uStack_38] = cVar1;
      if (cVar1 == '\0') {
        return uStack_38;
      }
      uStack_38 = uStack_38 + 1;
      timeptr_local = (tm *)((long)&timeptr_local->tm_sec + 1);
    }
    piVar2 = &timeptr_local->tm_sec;
    timeptr_local = (tm *)((long)&timeptr_local->tm_sec + 2);
    switch(*(undefined1 *)((long)piVar2 + 1)) {
    case 0x25:
      __s[uStack_38] = '%';
      uStack_38 = uStack_38 + 1;
      break;
    case 0x41:
      iVar3 = __tp->tm_wday;
      len_1 = (size_t)anon_var_dwarf_6e8f;
      if ((-1 < iVar3) && (iVar3 < 7)) {
        len_1 = (size_t)_PDCLIB_lc_time->day_name_full[iVar3];
      }
      sVar5 = strlen((char *)len_1);
      if (__maxsize - sVar5 <= uStack_38) {
        return 0;
      }
      strcpy(__s + uStack_38,(char *)len_1);
      uStack_38 = uStack_38 + sVar5;
      break;
    case 0x42:
      iVar3 = __tp->tm_mon;
      len_3 = (size_t)anon_var_dwarf_6e8f;
      if ((-1 < iVar3) && (iVar3 < 0xc)) {
        len_3 = (size_t)_PDCLIB_lc_time->month_name_full[iVar3];
      }
      sVar5 = strlen((char *)len_3);
      if (__maxsize - sVar5 <= uStack_38) {
        return 0;
      }
      strcpy(__s + uStack_38,(char *)len_3);
      uStack_38 = uStack_38 + sVar5;
      break;
    case 0x43:
      if (__maxsize - 2 <= uStack_38) {
        return 0;
      }
      dVar6 = div((__tp->tm_year + 0x76c) / 100,10);
      __s[uStack_38] = (char)dVar6.quot + '0';
      __s[uStack_38 + 1] = (char)dVar6.rem + '0';
      uStack_38 = uStack_38 + 2;
      break;
    case 0x44:
      sVar5 = strftime(__s + uStack_38,__maxsize - uStack_38,"%m/%d/%y",__tp);
      if (sVar5 == 0) {
        return 0;
      }
      uStack_38 = uStack_38 + sVar5;
      break;
    case 0x46:
      sVar5 = strftime(__s + uStack_38,__maxsize - uStack_38,"%Y-%m-%d",__tp);
      if (sVar5 == 0) {
        return 0;
      }
      uStack_38 = uStack_38 + sVar5;
      break;
    case 0x47:
      if (__maxsize - 4 <= uStack_38) {
        return 0;
      }
      digit.rem = week_calc((tm *)__tp,3);
      for (digit.quot = 3; -1 < digit.quot; digit.quot = digit.quot + -1) {
        dVar6 = div(digit.rem,10);
        __s[uStack_38 + (long)digit.quot] = (char)dVar6.rem + '0';
        hour.quot = dVar6.quot;
        digit.rem = hour.quot;
      }
      uStack_38 = uStack_38 + 4;
      break;
    case 0x48:
      if (__maxsize - 2 <= uStack_38) {
        return 0;
      }
      dVar6 = div(__tp->tm_hour,10);
      __s[uStack_38] = (char)dVar6.quot + '0';
      __s[uStack_38 + 1] = (char)dVar6.rem + '0';
      uStack_38 = uStack_38 + 2;
      break;
    case 0x49:
      if (__maxsize - 2 <= uStack_38) {
        return 0;
      }
      dVar6 = div((__tp->tm_hour + 0xb) % 0xc + 1,10);
      __s[uStack_38] = (char)dVar6.quot + '0';
      __s[uStack_38 + 1] = (char)dVar6.rem + '0';
      uStack_38 = uStack_38 + 2;
      break;
    case 0x4d:
      if (__maxsize - 2 <= uStack_38) {
        return 0;
      }
      dVar6 = div(__tp->tm_min,10);
      __s[uStack_38] = (char)dVar6.quot + '0';
      __s[uStack_38 + 1] = (char)dVar6.rem + '0';
      uStack_38 = uStack_38 + 2;
      break;
    case 0x52:
      sVar5 = strftime(__s + uStack_38,__maxsize - uStack_38,"%H:%M",__tp);
      if (sVar5 == 0) {
        return 0;
      }
      uStack_38 = uStack_38 + sVar5;
      break;
    case 0x53:
      if (__maxsize - 2 <= uStack_38) {
        return 0;
      }
      dVar6 = div(__tp->tm_sec,10);
      __s[uStack_38] = (char)dVar6.quot + '0';
      __s[uStack_38 + 1] = (char)dVar6.rem + '0';
      uStack_38 = uStack_38 + 2;
      break;
    case 0x54:
      sVar5 = strftime(__s + uStack_38,__maxsize - uStack_38,"%H:%M:%S",__tp);
      if (sVar5 == 0) {
        return 0;
      }
      uStack_38 = uStack_38 + sVar5;
      break;
    case 0x55:
      if (__maxsize - 2 <= uStack_38) {
        return 0;
      }
      iVar3 = week_calc((tm *)__tp,0);
      dVar6 = div(iVar3,10);
      __s[uStack_38] = (char)dVar6.quot + '0';
      __s[uStack_38 + 1] = (char)dVar6.rem + '0';
      uStack_38 = uStack_38 + 2;
      break;
    case 0x56:
      if (__maxsize - 2 <= uStack_38) {
        return 0;
      }
      iVar3 = week_calc((tm *)__tp,2);
      dVar6 = div(iVar3,10);
      __s[uStack_38] = (char)dVar6.quot + '0';
      __s[uStack_38 + 1] = (char)dVar6.rem + '0';
      uStack_38 = uStack_38 + 2;
      break;
    case 0x57:
      if (__maxsize - 2 <= uStack_38) {
        return 0;
      }
      iVar3 = week_calc((tm *)__tp,1);
      dVar6 = div(iVar3,10);
      __s[uStack_38] = (char)dVar6.quot + '0';
      __s[uStack_38 + 1] = (char)dVar6.rem + '0';
      uStack_38 = uStack_38 + 2;
      break;
    case 0x58:
      sVar5 = strftime(__s + uStack_38,__maxsize - uStack_38,_PDCLIB_lc_time->time_format,__tp);
      if (sVar5 == 0) {
        return 0;
      }
      uStack_38 = uStack_38 + sVar5;
      break;
    case 0x59:
      if (__maxsize - 4 <= uStack_38) {
        return 0;
      }
      digit_1.rem = __tp->tm_year + 0x76c;
      for (digit_1.quot = 3; -1 < digit_1.quot; digit_1.quot = digit_1.quot + -1) {
        dVar6 = div(digit_1.rem,10);
        __s[uStack_38 + (long)digit_1.quot] = (char)dVar6.rem + '0';
        local_180 = dVar6.quot;
        digit_1.rem = local_180;
      }
      uStack_38 = uStack_38 + 4;
      break;
    case 0x5a:
      break;
    case 0x61:
      iVar3 = __tp->tm_wday;
      len = (size_t)anon_var_dwarf_6e8f;
      if ((-1 < iVar3) && (iVar3 < 7)) {
        len = (size_t)_PDCLIB_lc_time->day_name_abbr[iVar3];
      }
      sVar5 = strlen((char *)len);
      if (__maxsize - sVar5 <= uStack_38) {
        return 0;
      }
      strcpy(__s + uStack_38,(char *)len);
      uStack_38 = uStack_38 + sVar5;
      break;
    case 0x62:
    case 0x68:
      iVar3 = __tp->tm_mon;
      len_2 = (size_t)anon_var_dwarf_6e8f;
      if ((-1 < iVar3) && (iVar3 < 0xc)) {
        len_2 = (size_t)_PDCLIB_lc_time->month_name_abbr[iVar3];
      }
      sVar5 = strlen((char *)len_2);
      if (__maxsize - sVar5 <= uStack_38) {
        return 0;
      }
      strcpy(__s + uStack_38,(char *)len_2);
      uStack_38 = uStack_38 + sVar5;
      break;
    case 99:
      sVar5 = strftime(__s + uStack_38,__maxsize - uStack_38,_PDCLIB_lc_time->date_time_format,__tp)
      ;
      if (sVar5 == 0) {
        return 0;
      }
      uStack_38 = uStack_38 + sVar5;
      break;
    case 100:
      if (__maxsize - 2 <= uStack_38) {
        return 0;
      }
      dVar6 = div(__tp->tm_mday,10);
      __s[uStack_38] = (char)dVar6.quot + '0';
      __s[uStack_38 + 1] = (char)dVar6.rem + '0';
      uStack_38 = uStack_38 + 2;
      break;
    case 0x65:
      if (__maxsize - 2 <= uStack_38) {
        return 0;
      }
      dVar6 = div(__tp->tm_mday,10);
      count_2._0_4_ = dVar6.quot;
      if ((int)count_2 < 1) {
        local_194 = ' ';
      }
      else {
        local_194 = (char)dVar6.quot + '0';
      }
      __s[uStack_38] = local_194;
      __s[uStack_38 + 1] = (char)dVar6.rem + '0';
      uStack_38 = uStack_38 + 2;
      break;
    case 0x67:
      if (__maxsize - 2 <= uStack_38) {
        return 0;
      }
      iVar3 = week_calc((tm *)__tp,3);
      dVar6 = div(iVar3 % 100,10);
      __s[uStack_38] = (char)dVar6.quot + '0';
      __s[uStack_38 + 1] = (char)dVar6.rem + '0';
      uStack_38 = uStack_38 + 2;
      break;
    case 0x6a:
      if (__maxsize - 3 <= uStack_38) {
        return 0;
      }
      dVar6 = div(__tp->tm_yday + 1,100);
      __s[uStack_38] = (char)dVar6.quot + '0';
      mon.rem = dVar6.rem;
      __s[uStack_38 + 1] = (char)(mon.rem / 10) + '0';
      __s[uStack_38 + 2] = (char)(mon.rem % 10) + '0';
      uStack_38 = uStack_38 + 3;
      break;
    case 0x6d:
      if (__maxsize - 2 <= uStack_38) {
        return 0;
      }
      dVar6 = div(__tp->tm_mon + 1,10);
      __s[uStack_38] = (char)dVar6.quot + '0';
      __s[uStack_38 + 1] = (char)dVar6.rem + '0';
      uStack_38 = uStack_38 + 2;
      break;
    case 0x6e:
      __s[uStack_38] = '\n';
      uStack_38 = uStack_38 + 1;
      break;
    case 0x70:
      uVar4 = (uint)(0xb < __tp->tm_hour);
      len_4 = (size_t)anon_var_dwarf_6e8f;
      if (uVar4 < 2) {
        len_4 = (size_t)_PDCLIB_lc_time->am_pm[(int)uVar4];
      }
      sVar5 = strlen((char *)len_4);
      if (__maxsize - sVar5 <= uStack_38) {
        return 0;
      }
      strcpy(__s + uStack_38,(char *)len_4);
      uStack_38 = uStack_38 + sVar5;
      break;
    case 0x72:
      sVar5 = strftime(__s + uStack_38,__maxsize - uStack_38,_PDCLIB_lc_time->time_format_12h,__tp);
      if (sVar5 == 0) {
        return 0;
      }
      uStack_38 = uStack_38 + sVar5;
      break;
    case 0x74:
      __s[uStack_38] = '\t';
      uStack_38 = uStack_38 + 1;
      break;
    case 0x75:
      if (__tp->tm_wday == 0) {
        local_198 = '7';
      }
      else {
        local_198 = (char)__tp->tm_wday + '0';
      }
      __s[uStack_38] = local_198;
      uStack_38 = uStack_38 + 1;
      break;
    case 0x77:
      __s[uStack_38] = (char)__tp->tm_wday + '0';
      uStack_38 = uStack_38 + 1;
      break;
    case 0x78:
      sVar5 = strftime(__s + uStack_38,__maxsize - uStack_38,_PDCLIB_lc_time->date_format,__tp);
      if (sVar5 == 0) {
        return 0;
      }
      uStack_38 = uStack_38 + sVar5;
      break;
    case 0x79:
      if (__maxsize - 2 <= uStack_38) {
        return 0;
      }
      dVar6 = div(__tp->tm_year % 100,10);
      __s[uStack_38] = (char)dVar6.quot + '0';
      __s[uStack_38 + 1] = (char)dVar6.rem + '0';
      uStack_38 = uStack_38 + 2;
      break;
    case 0x7a:
    }
  } while( true );
}

Assistant:

size_t strftime( char * _PDCLIB_restrict s, size_t maxsize, const char * _PDCLIB_restrict format, const struct tm * _PDCLIB_restrict timeptr )
{
    size_t rc = 0;

    while ( rc < maxsize )
    {
        if ( *format != '%' )
        {
            if ( ( s[rc] = *format++ ) == '\0' )
            {
                return rc;
            }
            else
            {
                ++rc;
            }
        }
        else
        {
            /* char flag = 0; */
            switch ( *++format )
            {
                case 'E':
                case 'O':
                    /* flag = *format++; */
                    break;

                default:
                    /* EMPTY */
                    break;
            }

            switch ( *format++ )
            {
                case 'a':
                {
                    /* tm_wday abbreviated */
                    SPRINTSTR( _PDCLIB_lc_time->day_name_abbr, timeptr->tm_wday, 6 );
                    break;
                }

                case 'A':
                {
                    /* tm_wday full */
                    SPRINTSTR( _PDCLIB_lc_time->day_name_full, timeptr->tm_wday, 6 );
                    break;
                }

                case 'b':
                case 'h':
                {
                    /* tm_mon abbreviated */
                    SPRINTSTR( _PDCLIB_lc_time->month_name_abbr, timeptr->tm_mon, 11 );
                    break;
                }

                case 'B':
                {
                    /* tm_mon full */
                    SPRINTSTR( _PDCLIB_lc_time->month_name_full, timeptr->tm_mon, 11 );
                    break;
                }

                case 'c':
                {
                    /* locale's date / time representation, %a %b %e %T %Y for C locale */
                    /* 'E' for locale's alternative representation */
                    SPRINTREC( _PDCLIB_lc_time->date_time_format );
                    break;
                }

                case 'C':
                {
                    /* tm_year divided by 100, truncated to decimal (00-99) */
                    /* 'E' for base year (period) in locale's alternative representation */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t period = div( ( ( timeptr->tm_year + 1900 ) / 100 ), 10 );
                        s[rc++] = '0' + period.quot;
                        s[rc++] = '0' + period.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'd':
                {
                    /* tm_mday as decimal (01-31) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t day = div( timeptr->tm_mday, 10 );
                        s[rc++] = '0' + day.quot;
                        s[rc++] = '0' + day.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'D':
                {
                    /* %m/%d/%y */
                    SPRINTREC( "%m/%d/%y" );
                    break;
                }

                case 'e':
                {
                    /* tm_mday as decimal ( 1-31) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t day = div( timeptr->tm_mday, 10 );
                        s[rc++] = ( day.quot > 0 ) ? '0' + day.quot : ' ';
                        s[rc++] = '0' + day.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'F':
                {
                    /* %Y-%m-%d */
                    SPRINTREC( "%Y-%m-%d" );
                    break;
                }

                case 'g':
                {
                    /* last 2 digits of the week-based year as decimal (00-99) */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t year = div( week_calc( timeptr, E_ISO_YEAR ) % 100, 10 );
                        s[rc++] = '0' + year.quot;
                        s[rc++] = '0' + year.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'G':
                {
                    /* week-based year as decimal (e.g. 1997) */
                    if ( rc < ( maxsize - 4 ) )
                    {
                        int year = week_calc( timeptr, E_ISO_YEAR );
                        int i;

                        for ( i = 3; i >= 0; --i )
                        {
                            div_t digit = div( year, 10 );
                            s[ rc + i ] = '0' + digit.rem;
                            year = digit.quot;
                        }

                        rc += 4;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'H':
                {
                    /* tm_hour as 24h decimal (00-23) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t hour = div( timeptr->tm_hour, 10 );
                        s[rc++] = '0' + hour.quot;
                        s[rc++] = '0' + hour.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'I':
                {
                    /* tm_hour as 12h decimal (01-12) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t hour = div( ( timeptr->tm_hour + 11 ) % 12 + 1, 10 );
                        s[rc++] = '0' + hour.quot;
                        s[rc++] = '0' + hour.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'j':
                {
                    /* tm_yday as decimal (001-366) */
                    if ( rc < ( maxsize - 3 ) )
                    {
                        div_t yday = div( timeptr->tm_yday + 1, 100 );
                        s[rc++] = '0' + yday.quot;
                        s[rc++] = '0' + yday.rem / 10;
                        s[rc++] = '0' + yday.rem % 10;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'm':
                {
                    /* tm_mon as decimal (01-12) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t mon = div( timeptr->tm_mon + 1, 10 );
                        s[rc++] = '0' + mon.quot;
                        s[rc++] = '0' + mon.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'M':
                {
                    /* tm_min as decimal (00-59) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t min = div( timeptr->tm_min, 10 );
                        s[rc++] = '0' + min.quot;
                        s[rc++] = '0' + min.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'n':
                {
                    /* newline */
                    s[rc++] = '\n';
                    break;
                }

                case 'p':
                {
                    /* tm_hour locale's AM/PM designations */
                    SPRINTSTR( _PDCLIB_lc_time->am_pm, timeptr->tm_hour > 11, 1 );
                    break;
                }

                case 'r':
                {
                    /* tm_hour / tm_min / tm_sec as locale's 12-hour clock time, %I:%M:%S %p for C locale */
                    SPRINTREC( _PDCLIB_lc_time->time_format_12h );
                    break;
                }

                case 'R':
                {
                    /* %H:%M */
                    SPRINTREC( "%H:%M" );
                    break;
                }

                case 'S':
                {
                    /* tm_sec as decimal (00-60) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t sec = div( timeptr->tm_sec, 10 );
                        s[rc++] = '0' + sec.quot;
                        s[rc++] = '0' + sec.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 't':
                {
                    /* tabulator */
                    s[rc++] = '\t';
                    break;
                }

                case 'T':
                {
                    /* %H:%M:%S */
                    SPRINTREC( "%H:%M:%S" );
                    break;
                }

                case 'u':
                {
                    /* tm_wday as decimal (1-7) with Monday == 1 */
                    /* 'O' for locale's alternative numeric symbols */
                    s[rc++] = ( timeptr->tm_wday == 0 ) ? '7' : '0' + timeptr->tm_wday;
                    break;
                }

                case 'U':
                {
                    /* week number of the year (first Sunday as the first day of week 1) as decimal (00-53) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t week = div( week_calc( timeptr, E_SUNDAY ), 10 );
                        s[rc++] = '0' + week.quot;
                        s[rc++] = '0' + week.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'V':
                {
                    /* ISO week number as decimal (01-53) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t week = div( week_calc( timeptr, E_ISO_WEEK ), 10 );
                        s[rc++] = '0' + week.quot;
                        s[rc++] = '0' + week.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'w':
                {
                    /* tm_wday as decimal number (0-6) with Sunday == 0 */
                    /* 'O' for locale's alternative numeric symbols */
                    s[rc++] = '0' + timeptr->tm_wday;
                    break;
                }

                case 'W':
                {
                    /* week number of the year (first Monday as the first day of week 1) as decimal (00-53) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t week = div( week_calc( timeptr, E_MONDAY ), 10 );
                        s[rc++] = '0' + week.quot;
                        s[rc++] = '0' + week.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'x':
                {
                    /* locale's date representation, %m/%d/%y for C locale */
                    /* 'E' for locale's alternative representation */
                    SPRINTREC( _PDCLIB_lc_time->date_format );
                    break;
                }

                case 'X':
                {
                    /* locale's time representation, %T for C locale */
                    /* 'E' for locale's alternative representation */
                    SPRINTREC( _PDCLIB_lc_time->time_format );
                    break;
                }

                case 'y':
                {
                    /* last 2 digits of tm_year as decimal (00-99) */
                    /* 'E' for offset from %EC (year only) in locale's alternative representation */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t year = div( ( timeptr->tm_year % 100 ), 10 );
                        s[rc++] = '0' + year.quot;
                        s[rc++] = '0' + year.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'Y':
                {
                    /* tm_year as decimal (e.g. 1997) */
                    /* 'E' for locale's alternative representation */
                    if ( rc < ( maxsize - 4 ) )
                    {
                        int year = timeptr->tm_year + 1900;
                        int i;

                        for ( i = 3; i >= 0; --i )
                        {
                            div_t digit = div( year, 10 );
                            s[ rc + i ] = '0' + digit.rem;
                            year = digit.quot;
                        }

                        rc += 4;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'z':
                {
                    /* tm_isdst / UTC offset in ISO8601 format (e.g. -0430 meaning 4 hours 30 minutes behind Greenwich), or no characters */
                    /* TODO: 'z' */
                    break;
                }

                case 'Z':
                {
                    /* tm_isdst / locale's time zone name or abbreviation, or no characters */
                    /* TODO: 'Z' */
                    break;
                }

                case '%':
                {
                    /* '%' character */
                    s[rc++] = '%';
                    break;
                }
            }
        }
    }

    return 0;
}